

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

bool despot::Variable::IsVariablePrevName
               (string *name,vector<despot::StateVar,_std::allocator<despot::StateVar>_> *vars)

{
  long lVar1;
  pointer pSVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  ulong uVar7;
  size_type *psVar8;
  
  pSVar2 = (vars->super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(vars->super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  if (lVar4 == 0) {
    bVar6 = false;
  }
  else {
    lVar4 = lVar4 >> 6;
    uVar7 = lVar4 * -0x5555555555555555;
    __n = name->_M_string_length;
    psVar8 = &(pSVar2->prev_name_)._M_string_length;
    bVar6 = true;
    uVar5 = 1;
    do {
      if (__n == *psVar8) {
        if (__n == 0) {
          return bVar6;
        }
        iVar3 = bcmp((name->_M_dataplus)._M_p,(((string *)(psVar8 + -1))->_M_dataplus)._M_p,__n);
        if (iVar3 == 0) {
          return bVar6;
        }
      }
      bVar6 = uVar5 <= uVar7 && uVar7 - uVar5 != 0;
      psVar8 = psVar8 + 0x18;
      lVar1 = uVar5 + (lVar4 * 0x5555555555555555 - (ulong)(uVar7 == 0));
      uVar5 = uVar5 + 1;
    } while (lVar1 != 0);
  }
  return bVar6;
}

Assistant:

bool Variable::IsVariablePrevName(string name, const vector<StateVar>& vars) {
	for (int i = 0; i < vars.size(); i++) {
		const StateVar& var = vars[i];
		if (name == var.prev_name())
			return true;
	}
	return false;
}